

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

int uv__open_cloexec(char *path,int flags)

{
  int fd;
  int iVar1;
  int *piVar2;
  
  fd = open("/",0x80000);
  if (fd == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == 0x16) {
      fd = open("/",0);
      if (fd == -1) {
        fd = -*piVar2;
      }
      else {
        iVar1 = uv__cloexec(fd,1);
        if (iVar1 != 0) {
          uv__close(fd);
          fd = iVar1;
        }
      }
    }
    else {
      fd = -*piVar2;
    }
  }
  return fd;
}

Assistant:

static int uv__open_cloexec(const char* path, int flags) {
  int err;
  int fd;

#if defined(__linux__)
  fd = open(path, flags | UV__O_CLOEXEC);
  if (fd != -1)
    return fd;

  if (errno != EINVAL)
    return -errno;

  /* O_CLOEXEC not supported. */
#endif

  fd = open(path, flags);
  if (fd == -1)
    return -errno;

  err = uv__cloexec(fd, 1);
  if (err) {
    uv__close(fd);
    return err;
  }

  return fd;
}